

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::TextureSubImage<1u,true>
          (StorageAndSubImageTest *this,GLenum target,GLuint texture,GLint level,
          GLint internalformat,GLsizei width,GLsizei height,GLsizei depth,GLenum format,GLenum type,
          GLvoid *data)

{
  ostringstream *this_00;
  RenderContext *pRVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  undefined4 in_register_00000084;
  Enum<int,_2UL> local_1e0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])
                    (pRVar1,CONCAT44(in_register_00000034,target),
                     CONCAT44(in_register_00000014,texture),CONCAT44(in_register_0000000c,level),
                     CONCAT44(in_register_00000084,internalformat));
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1480))(texture,level,0,width,format,type,data);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 != 0) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glTextureSubImage1D unexpectedly generated error ",0x31);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," during test with level ",0x18);
    std::ostream::operator<<(this_00,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", width ",8);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", format ",9);
    local_1d0.m_getName = glu::getTextureFormatName;
    local_1d0.m_value = format;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," and type ",10);
    local_1e0.m_getName = glu::getTypeName;
    local_1e0.m_value = type;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1e0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x480))(1,&this->m_to);
      this->m_to = 0;
    }
    iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar4 = (**(code **)(CONCAT44(extraout_var_01,iVar3) + 0x800))();
    } while (iVar4 != 0);
  }
  return iVar2 == 0;
}

Assistant:

bool StorageAndSubImageTest::TextureSubImage<1, true>(glw::GLenum target, glw::GLuint texture, glw::GLint level,
													  glw::GLint internalformat, glw::GLsizei width,
													  glw::GLsizei height, glw::GLsizei depth, glw::GLenum format,
													  glw::GLenum type, const glw::GLvoid* data)
{
	(void)target;
	(void)internalformat;
	(void)height;
	(void)depth;
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Action. */
	gl.textureSubImage1D(texture, level, 0, width, format, type, data);

	/* Error checking. */
	glw::GLenum error;

	if (GL_NO_ERROR != (error = gl.getError()))
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glTextureSubImage1D unexpectedly generated error " << glu::getErrorStr(error)
			<< " during test with level " << level << ", width " << width << ", format "
			<< glu::getTextureFormatStr(format) << " and type " << glu::getTypeStr(type) << "."
			<< tcu::TestLog::EndMessage;

		CleanTexture();
		CleanErrors();

		return false;
	}

	return true;
}